

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::TableCreateSignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,StructDef *struct_def,bool predecl,
          IDLOptions *opts)

{
  char *__rhs;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  EscapeKeyword(&local_50,this,(string *)struct_def);
  std::operator+(&local_170,"::flatbuffers::Offset<",&local_50);
  std::operator+(&local_150,&local_170,"> Create");
  EscapeKeyword(&local_190,this,(string *)struct_def);
  std::operator+(&local_130,&local_150,&local_190);
  std::operator+(&local_110,&local_130,"(");
  GetBuilder_abi_cxx11_(&local_1b0,this);
  std::operator+(&local_f0,&local_110,&local_1b0);
  std::operator+(&local_d0,&local_f0," &_fbb, const ");
  EscapeKeyword(&local_1f0,this,(string *)struct_def);
  NativeName(&local_1d0,&local_1f0,struct_def,opts);
  std::operator+(&local_b0,&local_d0,&local_1d0);
  std::operator+(&local_90,&local_b0," *_o, const ::flatbuffers::rehasher_function_t *_rehasher");
  __rhs = "";
  if (predecl) {
    __rhs = " = nullptr";
  }
  std::operator+(&local_70,&local_90,__rhs);
  std::operator+(__return_storage_ptr__,&local_70,")");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string TableCreateSignature(const StructDef &struct_def, bool predecl,
                                   const IDLOptions &opts) {
    return "::flatbuffers::Offset<" + Name(struct_def) + "> Create" +
           Name(struct_def) + "(" + GetBuilder() + " &_fbb, const " +
           NativeName(Name(struct_def), &struct_def, opts) +
           " *_o, const ::flatbuffers::rehasher_function_t *_rehasher" +
           (predecl ? " = nullptr" : "") + ")";
  }